

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_support.c
# Opt level: O2

ssize_t uper_get_nslength(asn_per_data_t *pd)

{
  int32_t iVar1;
  undefined8 in_RAX;
  ulong uVar2;
  ulong uVar3;
  int repeat;
  
  repeat = (int)((ulong)in_RAX >> 0x20);
  iVar1 = per_get_few_bits(pd,1);
  if (iVar1 == 0) {
    iVar1 = per_get_few_bits(pd,6);
    if (iVar1 < 0) {
      uVar3 = 0xffffffffffffffff;
    }
    else {
      uVar3 = (ulong)(iVar1 + 1);
    }
  }
  else {
    uVar2 = uper_get_length(pd,-1,&repeat);
    uVar3 = 0xffffffffffffffff;
    if (-1 < (long)uVar2) {
      uVar3 = -(ulong)(repeat != 0) | uVar2;
    }
  }
  return uVar3;
}

Assistant:

ssize_t
uper_get_nslength(asn_per_data_t *pd) {
	ssize_t length;

	ASN_DEBUG("Getting normally small length");

	if(per_get_few_bits(pd, 1) == 0) {
		length = per_get_few_bits(pd, 6) + 1;
		if(length <= 0) return -1;
		ASN_DEBUG("l=%d", (int)length);
		return length;
	} else {
		int repeat;
		length = uper_get_length(pd, -1, &repeat);
		if(length >= 0 && !repeat) return length;
		return -1; /* Error, or do not support >16K extensions */
	}
}